

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

void __thiscall cfd::TransactionContext::TransactionContext(TransactionContext *this)

{
  _Rb_tree_header *p_Var1;
  
  cfd::core::Transaction::Transaction(&this->super_Transaction);
  *(undefined ***)this = &PTR__TransactionContext_002b1028;
  (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->utxo_map_).super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->signed_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->signed_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->verify_map_).super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->verify_map_).super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->verify_map_).super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->verify_ignore_map_).
  super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->verify_ignore_map_).
  super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->verify_ignore_map_).
  super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Rb_tree<cfd::core::OutPoint,_std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>,_std::_Select1st<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::SigHashType>_>_>
  ::clear(&(this->signed_map_)._M_t);
  std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::clear(&this->verify_map_);
  std::vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>::clear
            (&this->verify_ignore_map_);
  return;
}

Assistant:

TransactionContext::TransactionContext() {
  utxo_map_.clear();
  signed_map_.clear();
  verify_map_.clear();
  verify_ignore_map_.clear();
}